

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateExpandDimsLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  _Base_ptr p_Var1;
  _Rb_tree_color _Var2;
  uint uVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  long *plVar9;
  undefined1 *puVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  undefined8 *puVar12;
  uint32_t uVar13;
  int iVar14;
  size_type *psVar15;
  _Base_ptr p_Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  int iVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  undefined1 *puVar21;
  _Alloc_hider _Var22;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  int iVar27;
  string err_1;
  int a;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  iterator iStack_80;
  int *local_78;
  int local_64;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar17 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar17) {
    operator_delete(pcVar5,paVar17->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar17) {
    operator_delete(pcVar5,paVar17->_M_allocated_capacity + 1);
  }
  uVar13 = layer->_oneof_case_[0];
  puVar10 = *(undefined1 **)&layer->layer_;
  puVar21 = puVar10;
  if (uVar13 != 0x465) {
    puVar21 = Specification::_ExpandDimsLayerParams_default_instance_;
  }
  iVar14 = (((ConvolutionLayerParams *)puVar21)->kernelsize_).current_size_;
  if (iVar14 == 0) {
    plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    lVar6 = *plVar9;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,lVar6,plVar9[1] + lVar6);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x3c0fe9);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_e8.field_2._M_allocated_capacity = *psVar15;
      local_e8.field_2._8_8_ = plVar9[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar15;
      local_e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_e8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar15) {
      local_60._16_8_ = *psVar15;
      local_60._24_8_ = plVar9[3];
      local_60._0_8_ = local_60 + 0x10;
    }
    else {
      local_60._16_8_ = *psVar15;
      local_60._0_8_ = (size_type *)*plVar9;
    }
    local_60._8_8_ = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
    if ((undefined1 *)local_60._0_8_ == local_60 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    return __return_storage_ptr__;
  }
  p_Var1 = (_Base_ptr)(local_60 + 8);
  local_60._8_8_ = (ulong)(uint)local_60._12_4_ << 0x20;
  iVar27 = 0;
  local_60._16_8_ = (undefined1 *)0x0;
  local_38 = 0;
  local_60._24_8_ = p_Var1;
  local_40 = p_Var1;
  if (0 < iVar14) {
    do {
      plVar9 = google::protobuf::RepeatedField<long>::Get
                         (&((ReshapeLayerParams *)puVar21)->targetshape_,iVar27);
      iVar14 = (int)*plVar9;
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(local_88._4_4_,iVar14);
      p_Var7 = (_Base_ptr)local_60._16_8_;
      p_Var24 = p_Var1;
      if ((undefined1 *)local_60._16_8_ != (undefined1 *)0x0) {
        do {
          p_Var23 = p_Var24;
          p_Var16 = p_Var7;
          _Var2 = p_Var16[1]._M_color;
          p_Var24 = p_Var16;
          if ((int)_Var2 < iVar14) {
            p_Var24 = p_Var23;
          }
          p_Var7 = (&p_Var16->_M_left)[(int)_Var2 < iVar14];
        } while ((&p_Var16->_M_left)[(int)_Var2 < iVar14] != (_Base_ptr)0x0);
        if (p_Var24 != p_Var1) {
          if ((int)_Var2 < iVar14) {
            p_Var16 = p_Var23;
          }
          if ((int)p_Var16[1]._M_color <= iVar14) {
            plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            lVar6 = *plVar9;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_a8,lVar6,plVar9[1] + lVar6);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x3c0fe9);
            psVar15 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_c8.field_2._M_allocated_capacity = *psVar15;
              local_c8.field_2._8_8_ = plVar9[3];
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar15;
              local_c8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_c8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar15;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            psVar15 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_e8.field_2._M_allocated_capacity = *psVar15;
              local_e8.field_2._8_8_ = puVar12[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *psVar15;
              local_e8._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_e8._M_string_length = puVar12[1];
            *puVar12 = psVar15;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e8);
            goto LAB_0035029f;
          }
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 local_60,(int *)&local_88);
      uVar13 = layer->_oneof_case_[0];
      puVar10 = *(undefined1 **)&layer->layer_;
      puVar21 = puVar10;
      if (uVar13 != 0x465) {
        puVar21 = Specification::_ExpandDimsLayerParams_default_instance_;
      }
      iVar27 = iVar27 + 1;
    } while (iVar27 < (((ConvolutionLayerParams *)puVar21)->kernelsize_).current_size_);
  }
  if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) {
LAB_00350313:
    Result::Result(__return_storage_ptr__);
  }
  else {
    uVar3 = *(uint *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                     0x24);
    if (uVar13 != 0x465) {
      puVar10 = Specification::_ExpandDimsLayerParams_default_instance_;
    }
    iVar14 = (((ConvolutionLayerParams *)puVar10)->kernelsize_).current_size_;
    if (*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24)
        + iVar14 == uVar3) {
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      iStack_80._M_current = (int *)0x0;
      local_78 = (int *)0x0;
      iVar27 = 0;
      do {
        puVar10 = Specification::_ExpandDimsLayerParams_default_instance_;
        if (layer->_oneof_case_[0] == 0x465) {
          puVar10 = *(undefined1 **)&layer->layer_;
        }
        plVar9 = google::protobuf::RepeatedField<long>::Get
                           (&((ReshapeLayerParams *)puVar10)->targetshape_,iVar27);
        local_64 = ((int)*plVar9 >> 0x1f & uVar3) + (int)*plVar9;
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_88,iStack_80._M_current,&local_64);
        if (_Var11._M_current != iStack_80._M_current) {
          plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar6 = *plVar9;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_a8,lVar6,plVar9[1] + lVar6);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x3c0fe9);
          psVar15 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_c8.field_2._M_allocated_capacity = *psVar15;
            local_c8.field_2._8_8_ = plVar9[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar15;
            local_c8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_c8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_e8.field_2._M_allocated_capacity = *psVar15;
            local_e8.field_2._8_8_ = puVar12[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar15;
            local_e8._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_e8._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e8);
          goto LAB_003504b9;
        }
        if (_Var11._M_current == local_78) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_88,iStack_80,&local_64);
        }
        else {
          *iStack_80._M_current = local_64;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        iVar27 = iVar27 + 1;
      } while (iVar14 != iVar27);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_88->_M_local_buf + 4);
      iVar14 = *(int *)local_88;
      paVar19 = local_88;
      paVar25 = local_88;
      paVar26 = paVar17;
      iVar27 = iVar14;
      if (paVar17 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_80._M_current &&
          local_88 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_80._M_current) {
        do {
          iVar4 = *(int *)paVar26;
          iVar18 = iVar27;
          if (iVar27 <= iVar4) {
            iVar18 = iVar4;
          }
          if (iVar27 < iVar4) {
            paVar25 = paVar26;
          }
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar26 + 4);
          iVar27 = iVar18;
        } while (paVar26 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)iStack_80._M_current);
        do {
          if (*(int *)paVar17 < iVar14) {
            paVar19 = paVar17;
            iVar14 = *(int *)paVar17;
          }
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar17 + 4);
          iVar27 = *(int *)paVar25;
        } while (paVar17 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)iStack_80._M_current);
      }
      if ((iVar27 < (int)uVar3) && (-1 < *(int *)paVar19)) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
        goto LAB_00350313;
      }
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar6 = *plVar9;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a8,lVar6,plVar9[1] + lVar6);
      std::operator+(&local_c8,"ExpandDims Layer \'",&local_a8);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_e8.field_2._M_allocated_capacity = *psVar15;
        local_e8.field_2._8_8_ = puVar12[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar15;
        local_e8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_e8._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e8);
LAB_003504b9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_88 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_003504ea;
      uVar20 = (long)local_78 - (long)local_88;
      _Var22._M_p = (pointer)local_88;
    }
    else {
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar6 = *plVar9;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a8,lVar6,plVar9[1] + lVar6);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x3c0fe9);
      psVar15 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_c8.field_2._M_allocated_capacity = *psVar15;
        local_c8.field_2._8_8_ = plVar9[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar15;
        local_c8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_c8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_e8.field_2._M_allocated_capacity = *psVar15;
        local_e8.field_2._8_8_ = puVar12[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar15;
        local_e8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_e8._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e8);
LAB_0035029f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_003504ea;
      uVar20 = local_e8.field_2._M_allocated_capacity + 1;
      _Var22._M_p = local_e8._M_dataplus._M_p;
    }
    operator_delete(_Var22._M_p,uVar20);
  }
LAB_003504ea:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_60);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateExpandDimsLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (layer.expanddims().axes_size() == 0) {
        std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // either all values in axes must be positive or all negative
    std::set<int> axes_set;
    for (int i=0; i<layer.expanddims().axes_size(); i++) {
        int a = (int)layer.expanddims().axes(i);
        if (axes_set.find(a) != axes_set.end()) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else {
            axes_set.insert(a);
        }
    }

    if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
        int input_rank = static_cast<int>(layer.inputtensor(0).rank());
        int output_rank = static_cast<int>(layer.outputtensor(0).rank());
        int axes_length = layer.expanddims().axes_size();

        if (input_rank + axes_length != output_rank) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': input rank plus the length of the axes parameter must equal output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        std::vector<int> axes;
        for (int i=0; i<axes_length; i++) {
            int a = (int)layer.expanddims().axes(i);
            if (a < 0) {
                a = output_rank + a;
            }
            if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
            axes.push_back(a);
        }

        int max_value = *std::max_element(axes.begin(), axes.end());
        int min_value = *std::min_element(axes.begin(), axes.end());
        if (max_value > output_rank - 1 || min_value < 0) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}